

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O2

aiReturn __thiscall Assimp::Importer::RegisterPPStep(Importer *this,BaseProcess *pImp)

{
  Logger *this_00;
  BaseProcess *local_10;
  
  local_10 = pImp;
  if (pImp != (BaseProcess *)0x0) {
    std::vector<Assimp::BaseProcess_*,_std::allocator<Assimp::BaseProcess_*>_>::push_back
              (&this->pimpl->mPostProcessingSteps,&local_10);
    this_00 = DefaultLogger::get();
    Logger::info(this_00,"Registering custom post-processing step");
    return aiReturn_SUCCESS;
  }
  __assert_fail("__null != pImp",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/Importer.cpp"
                ,0xcc,"aiReturn Assimp::Importer::RegisterPPStep(BaseProcess *)");
}

Assistant:

aiReturn Importer::RegisterPPStep(BaseProcess* pImp)
{
    ai_assert(NULL != pImp);
    ASSIMP_BEGIN_EXCEPTION_REGION();

        pimpl->mPostProcessingSteps.push_back(pImp);
        ASSIMP_LOG_INFO("Registering custom post-processing step");

    ASSIMP_END_EXCEPTION_REGION(aiReturn);
    return AI_SUCCESS;
}